

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O0

bool __thiscall
embree::SceneLoadingTutorialApplication::scene_empty_post_parse
          (SceneLoadingTutorialApplication *this)

{
  size_t sVar1;
  size_type sVar2;
  long in_RDI;
  undefined1 local_11;
  
  sVar1 = SceneGraph::GroupNode::size((GroupNode *)0x126f3b);
  local_11 = false;
  if (sVar1 == 0) {
    sVar2 = std::vector<embree::FileName,_std::allocator<embree::FileName>_>::size
                      ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                       (in_RDI + 0x3c0));
    local_11 = false;
    if (sVar2 == 0) {
      sVar2 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                        ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                         )(in_RDI + 0x398));
      local_11 = sVar2 == 0;
    }
  }
  return local_11;
}

Assistant:

bool scene_empty_post_parse() const {
      return scene->size() == 0 && sceneFilename.size() == 0 && futures.size() == 0;
    }